

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  int iVar2;
  char local_78;
  char local_77;
  char local_76;
  char local_75;
  char local_74;
  undefined1 local_73;
  char local_72;
  char local_71;
  char zBuf [24];
  int local_54;
  int s;
  int Y;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  x._40_8_ = argv;
  iVar2 = isDate(context,argc,argv,(DateTime *)&s);
  if (iVar2 == 0) {
    computeYMD_HMS((DateTime *)&s);
    local_54 = (int)x.iJD;
    if ((int)x.iJD < 0) {
      local_54 = -(int)x.iJD;
    }
    local_77 = (char)((long)((ulong)(uint)((int)((long)local_54 / 1000) >> 0x1f) << 0x20 |
                            (long)local_54 / 1000 & 0xffffffffU) % 10) + '0';
    local_76 = (char)((long)((ulong)(uint)((int)((long)local_54 / 100) >> 0x1f) << 0x20 |
                            (long)local_54 / 100 & 0xffffffffU) % 10) + '0';
    local_75 = (char)((long)((ulong)(uint)((int)((long)local_54 / 10) >> 0x1f) << 0x20 |
                            (long)local_54 / 10 & 0xffffffffU) % 10) + '0';
    local_74 = (char)(local_54 % 10) + '0';
    local_73 = 0x2d;
    local_72 = (char)((long)((ulong)(uint)((int)((long)x.iJD._4_4_ / 10) >> 0x1f) << 0x20 |
                            (long)x.iJD._4_4_ / 10 & 0xffffffffU) % 10) + '0';
    local_71 = (char)(x.iJD._4_4_ % 10) + '0';
    zBuf[0] = '-';
    zBuf[1] = (char)((long)((ulong)(uint)((int)((long)x.Y / 10) >> 0x1f) << 0x20 |
                           (long)x.Y / 10 & 0xffffffffU) % 10) + '0';
    zBuf[2] = (char)(x.Y % 10) + '0';
    zBuf[3] = ' ';
    zBuf[4] = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                           (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    zBuf[5] = (char)(x.M % 10) + '0';
    zBuf[6] = ':';
    zBuf[7] = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                           (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    zBuf[8] = (char)(x.D % 10) + '0';
    zBuf[9] = ':';
    uVar1 = (long)(int)(double)x._24_8_ / 10;
    zBuf[10] = (char)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 10) +
               '0';
    zBuf[0xb] = (char)((int)(double)x._24_8_ % 10) + '0';
    zBuf[0xc] = '\0';
    if ((int)x.iJD < 0) {
      local_78 = '-';
      sqlite3_result_text(context,&local_78,0x14,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(context,&local_77,0x13,(_func_void_void_ptr *)0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s;
    char zBuf[24];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    s = (int)x.s;
    zBuf[18] = '0' + (s/10)%10;
    zBuf[19] = '0' + (s)%10;
    zBuf[20] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 20, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 19, SQLITE_TRANSIENT);
    }
  }
}